

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_kmgmt.c
# Opt level: O0

void * sm2_gen(void *genctx,OSSL_CALLBACK *osslcb,void *cbarg)

{
  int iVar1;
  point_conversion_form_t form;
  uint uVar2;
  EC_KEY *key;
  ec_gen_ctx *in_RDI;
  int format;
  int flags;
  int ret;
  EC_KEY *ec;
  ec_gen_ctx *gctx;
  EC_KEY *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  undefined4 uVar4;
  
  uVar4 = 1;
  if ((in_RDI == (ec_gen_ctx *)0x0) ||
     (key = EC_KEY_new_ex((OSSL_LIB_CTX *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          (char *)in_stack_ffffffffffffffb8), key == (EC_KEY *)0x0)) {
    return (void *)0x0;
  }
  if (in_RDI->gen_group == (EC_GROUP *)0x0) {
    iVar1 = ec_gen_set_group_from_params(in_RDI);
    if (iVar1 == 0) goto LAB_00334a15;
  }
  else {
    if (in_RDI->encoding != (char *)0x0) {
      in_stack_ffffffffffffffc8 =
           ossl_ec_encoding_name2id((char *)CONCAT44(uVar4,in_stack_ffffffffffffffc8));
      if (in_stack_ffffffffffffffc8 < 0) goto LAB_00334a15;
      EC_GROUP_set_asn1_flag((EC_GROUP *)in_RDI->gen_group,in_stack_ffffffffffffffc8);
    }
    if (in_RDI->pt_format != (char *)0x0) {
      form = ossl_ec_pt_format_name2id((char *)CONCAT44(uVar4,in_stack_ffffffffffffffc8));
      if ((int)form < 0) goto LAB_00334a15;
      EC_GROUP_set_point_conversion_form((EC_GROUP *)in_RDI->gen_group,form);
    }
  }
  uVar2 = ec_gen_assign_group(in_stack_ffffffffffffffb8,(EC_GROUP *)0x3349be);
  if ((in_RDI->selection & 3U) != 0) {
    uVar3 = 0;
    if (uVar2 != 0) {
      iVar1 = EC_KEY_generate_key((EC_KEY *)key);
      uVar3 = (uint)(iVar1 != 0) << 0x18;
    }
    uVar2 = uVar3 >> 0x18;
  }
  if (uVar2 != 0) {
    return key;
  }
LAB_00334a15:
  EC_KEY_free((EC_KEY *)key);
  return (void *)0x0;
}

Assistant:

static void *sm2_gen(void *genctx, OSSL_CALLBACK *osslcb, void *cbarg)
{
    struct ec_gen_ctx *gctx = genctx;
    EC_KEY *ec = NULL;
    int ret = 1;

    if (gctx == NULL
        || (ec = EC_KEY_new_ex(gctx->libctx, NULL)) == NULL)
        return NULL;

    if (gctx->gen_group == NULL) {
        if (!ec_gen_set_group_from_params(gctx))
            goto err;
    } else {
        if (gctx->encoding) {
            int flags = ossl_ec_encoding_name2id(gctx->encoding);

            if (flags < 0)
                goto err;
            EC_GROUP_set_asn1_flag(gctx->gen_group, flags);
        }
        if (gctx->pt_format != NULL) {
            int format = ossl_ec_pt_format_name2id(gctx->pt_format);

            if (format < 0)
                goto err;
            EC_GROUP_set_point_conversion_form(gctx->gen_group, format);
        }
    }

    /* We must always assign a group, no matter what */
    ret = ec_gen_assign_group(ec, gctx->gen_group);

    /* Whether you want it or not, you get a keypair, not just one half */
    if ((gctx->selection & OSSL_KEYMGMT_SELECT_KEYPAIR) != 0)
        ret = ret && EC_KEY_generate_key(ec);

    if (ret)
        return ec;
err:
    /* Something went wrong, throw the key away */
    EC_KEY_free(ec);
    return NULL;
}